

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

int stb_idict_init(stb_idict *h,int count)

{
  stb__stb_idict__hashpair *psVar1;
  int local_20;
  int local_1c;
  int i;
  int count_local;
  stb_idict *h_local;
  
  local_1c = count;
  if (count < 4) {
    local_1c = 4;
  }
  h->limit = local_1c;
  h->count = 0;
  h->mask = local_1c - 1;
  h->deleted = 0;
  h->grow_threshhold = (int)((float)local_1c * 0.85);
  h->has_del = '\0';
  h->has_empty = '\0';
  h->alloced = '\0';
  if (local_1c < 0x41) {
    h->shrink_threshhold = 0;
  }
  else {
    h->shrink_threshhold = (int)((double)local_1c * 0.3777777883741591);
  }
  h->delete_threshhold = (int)(((float)local_1c * 0.14999998) / 2.0);
  psVar1 = (stb__stb_idict__hashpair *)malloc((long)local_1c << 3);
  h->table = psVar1;
  if (h->table == (stb__stb_idict__hashpair *)0x0) {
    h_local._4_4_ = 0;
  }
  else {
    for (local_20 = 0; local_20 < local_1c; local_20 = local_20 + 1) {
      h->table[local_20].k = 1;
    }
    h_local._4_4_ = 1;
  }
  return h_local._4_4_;
}

Assistant:

stb_define_hash_base(STB_noprefix, stb_idict, short type; short gc; STB_nofields, stb_idict_,stb_idict_,0.85f,
              stb_int32,STB_IEMPTY,STB_IDEL,STB_nocopy,STB_nodelete,STB_nosafe,
              STB_equal,STB_equal,
              return stb_rehash_improved(k);,stb_int32,STB_nonullvalue,0)

stb_idict * stb_idict_new_size(int size)
{
   stb_idict *e = (stb_idict *) malloc(sizeof(*e));
   if (e) {
      if (!stb_is_pow2(size))
         size = 1 << stb_log2_ceil(size);
      stb_idict_init(e, size);
      e->alloced = 1;
   }
   return e;
}